

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

qulonglong __thiscall QByteArray::toULongLong(QByteArray *this,bool *ok,int base)

{
  unsigned_long_long uVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  undefined4 in_stack_ffffffffffffffe8;
  
  qToByteArrayViewIgnoringNull<QByteArray,_true>
            ((QByteArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  uVar1 = QtPrivate::toIntegral<unsigned_long_long,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000030,in_RSI,in_stack_0000002c);
  return uVar1;
}

Assistant:

qulonglong QByteArray::toULongLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<qulonglong>(qToByteArrayViewIgnoringNull(*this), ok, base);
}